

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ResultBuilder::translateException(ResultBuilder *this)

{
  long in_RDI;
  String *other;
  String *in_stack_ffffffffffffffd0;
  String local_20;
  
  *(undefined1 *)(in_RDI + 0x29) = 1;
  other = &local_20;
  anon_unknown_14::translateActiveException();
  String::operator=(in_stack_ffffffffffffffd0,other);
  String::~String(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void ResultBuilder::translateException() {
        m_threw     = true;
        m_exception = translateActiveException();
    }